

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void i_number_suite::i_number_too_big_pos_int(void)

{
  char input [22];
  reader reader;
  undefined4 local_19c;
  view_type local_198 [2];
  char local_178 [32];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_178,"100000000000000000000",0x16);
  local_198[0]._M_len = strlen(local_178);
  local_198[0]._M_str = local_178;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,local_198);
  local_198[0]._M_len = CONCAT44(local_198[0]._M_len._4_4_,local_158.decoder.current.code);
  local_19c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x6b,"void i_number_suite::i_number_too_big_pos_int()",local_198,&local_19c);
  local_198[0]._M_len =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_198[0]._M_str = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[22]>
            ("reader.literal()","\"100000000000000000000\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x6c,"void i_number_suite::i_number_too_big_pos_int()",local_198,
             "100000000000000000000");
  trial::protocol::json::basic_reader<char>::value<unsigned_long_long>(&local_158);
  boost::detail::throw_failed_impl
            ("reader.value<unsigned long long int>()","json::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x70,"void i_number_suite::i_number_too_big_pos_int()");
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void i_number_too_big_pos_int()
{
    const char input[] = "100000000000000000000";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "100000000000000000000");
    // Cannot be represented by integers
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<unsigned long long int>(),
                                    json::error,
                                    "invalid value");
}